

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseVariantIndex.cpp
# Opt level: O3

uint __thiscall
Indexing::HashingClauseVariantIndex::computeHashAndCountVariables
          (HashingClauseVariantIndex *this,Literal *l,VarCounts *varCnts,uint hash_begin)

{
  anon_union_8_2_f154dc0f_for_Term_10 *paVar1;
  Comparison CVar2;
  uint uVar3;
  size_t i;
  long lVar4;
  int iVar5;
  uint uVar6;
  Literal *pLVar7;
  TermList *arg;
  anon_union_8_2_f154dc0f_for_Term_10 *tl1;
  anon_union_8_2_f154dc0f_for_Term_10 *ptl;
  int local_34;
  Literal *local_30;
  
  uVar3 = *(uint *)&(l->super_Term).field_0xc;
  iVar5 = 0;
  pLVar7 = l;
  if ((int)uVar3 < 0) {
    iVar5 = 0;
    do {
      pLVar7 = *(Literal **)&(pLVar7->super_Term).field_9._vars;
      if (((ulong)pLVar7 & 1) != 0) {
        uVar6 = 3;
        goto LAB_002bbe27;
      }
      iVar5 = iVar5 + 2;
    } while (*(int *)&(pLVar7->super_Term).field_0xc < 0);
  }
  uVar6 = (pLVar7->super_Term).field_9._vars;
LAB_002bbe27:
  if (iVar5 + uVar6 == 0) {
    local_30 = l;
    lVar4 = 0;
    do {
      hash_begin = (*(byte *)((long)&local_30 + lVar4) ^ hash_begin) * 0x1000193;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 8);
  }
  else {
    uVar6 = (l->super_Term)._functor;
    local_34 = ((uint)(l->super_Term)._args[0]._content >> 2 & 1) + uVar6 * 2;
    lVar4 = 0;
    do {
      hash_begin = (*(byte *)((long)&local_34 + lVar4) ^ hash_begin) * 0x1000193;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    tl1 = (anon_union_8_2_f154dc0f_for_Term_10 *)((l->super_Term)._args + (uVar3 & 0xfffffff));
    if (uVar6 == 0) {
      paVar1 = tl1 + -1;
      CVar2 = VariableIgnoringComparator::compare(&tl1->_sort,&paVar1->_sort);
      ptl = paVar1;
      if (CVar2 == LESS) {
        ptl = tl1;
        tl1 = paVar1;
      }
      uVar3 = computeHashAndCountVariables(this,&tl1->_sort,varCnts,hash_begin);
      uVar3 = computeHashAndCountVariables(this,&ptl->_sort,varCnts,uVar3);
      return uVar3;
    }
    uVar3 = tl1->_vars;
    while ((uVar3 & 3) != 2) {
      hash_begin = computeHashAndCountVariables(this,&tl1->_sort,varCnts,hash_begin);
      paVar1 = tl1 + -1;
      tl1 = tl1 + -1;
      uVar3 = paVar1->_vars;
    }
  }
  return hash_begin;
}

Assistant:

unsigned HashingClauseVariantIndex::computeHashAndCountVariables(Literal* l, VarCounts& varCnts, unsigned hash_begin) {
  //cout << "Literal " << l->toString() << endl;

  if (l->ground()) {
    // no variables to count
    // just hash the pointer
    return DefaultHash::hash(l, hash_begin);
  }

  //cout << "will hash header " << header << endl;

  unsigned header = l->header();

  // hashes the predicate symbol and the polarity
  unsigned hash = DefaultHash::hash(header, hash_begin);

  if(l->isEquality()) {
    TermList* ll = l->nthArgument(0);
    TermList* lr = l->nthArgument(1);
    if (VariableIgnoringComparator::compare(ll,lr) == LESS) {
      swap(ll,lr);
    }

    hash = computeHashAndCountVariables(ll,varCnts,hash);
    hash = computeHashAndCountVariables(lr,varCnts,hash);
  } else {
    for(TermList* arg=l->args(); arg->isNonEmpty(); arg=arg->next()) {
      hash = computeHashAndCountVariables(arg,varCnts,hash);
    }
  }

  return hash;
}